

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

void __thiscall
sglr::rc::TextureCube::sample4(TextureCube *this,Vec4 *output,Vec3 *packetTexcoords,float lodBias)

{
  ulong uVar1;
  CubeFace CVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  float fVar5;
  float fVar6;
  float fVar7;
  uint uVar8;
  uint uVar11;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  Vec2 coords [4];
  undefined1 local_88 [8];
  undefined1 local_80 [8];
  undefined1 local_78 [8];
  undefined1 local_70 [16];
  Vec3 *local_60;
  Vec3 *local_58;
  Vec3 *local_50;
  Sampler *local_48;
  int local_40;
  undefined4 uStack_3c;
  ConstPixelBufferAccess *pCStack_38;
  
  if ((this->m_view).m_numLevels < 1) {
    fVar5 = 0.0;
  }
  else {
    fVar5 = (float)((this->m_view).m_levels[0]->m_size).m_data[0];
  }
  local_48 = (Sampler *)&this->m_view;
  local_50 = packetTexcoords + 1;
  local_58 = packetTexcoords + 2;
  local_60 = packetTexcoords + 3;
  uVar3 = 0;
  do {
    CVar2 = tcu::selectCubeFace(packetTexcoords);
    tcu::projectToFace((CubeFace)local_88,(Vec3 *)(ulong)CVar2);
    tcu::projectToFace((CubeFace)local_80,(Vec3 *)(ulong)CVar2);
    tcu::projectToFace((CubeFace)local_78,(Vec3 *)(ulong)CVar2);
    tcu::projectToFace((CubeFace)local_70,(Vec3 *)(ulong)CVar2);
    uVar8 = (int)((uint)(uVar3 < 2) << 0x1f) >> 0x1f;
    uVar11 = (int)((uint)(uVar3 < 2) << 0x1f) >> 0x1f;
    uVar1 = CONCAT44(~uVar11 & (uint)(SUB84(local_70._0_8_,4) - local_78._4_4_),
                     ~uVar8 & (uint)((float)local_70._0_8_ - local_78._0_4_)) |
            CONCAT44((uint)(local_80._4_4_ - local_88._4_4_) & uVar11,
                     (uint)(local_80._0_4_ - local_88._0_4_) & uVar8);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar1;
    auVar12._0_8_ = uVar1 ^ 0x8000000080000000;
    auVar12._8_4_ = 0x80000000;
    auVar12._12_4_ = 0x80000000;
    auVar9 = maxps(auVar12,auVar9);
    uVar8 = (uint)((uVar3 & 1) == 0);
    uVar11 = (int)(uVar8 << 0x1f) >> 0x1f;
    uVar8 = (int)(uVar8 << 0x1f) >> 0x1f;
    uVar1 = CONCAT44(~uVar8 & (uint)(SUB84(local_70._0_8_,4) - local_80._4_4_),
                     ~uVar11 & (uint)((float)local_70._0_8_ - local_80._0_4_)) |
            CONCAT44((uint)(local_78._4_4_ - local_88._4_4_) & uVar8,
                     (uint)(local_78._0_4_ - local_88._0_4_) & uVar11);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar1;
    auVar4._0_8_ = uVar1 ^ 0x8000000080000000;
    auVar4._8_4_ = 0x80000000;
    auVar4._12_4_ = 0x80000000;
    auVar4 = maxps(auVar4,auVar10);
    uVar8 = -(uint)(auVar4._0_4_ <= auVar9._0_4_);
    uVar11 = -(uint)(auVar4._4_4_ <= auVar9._4_4_);
    fVar6 = (float)(~uVar8 & (uint)auVar4._0_4_ | (uint)auVar9._0_4_ & uVar8) * fVar5;
    fVar7 = (float)(~uVar11 & (uint)auVar4._4_4_ | (uint)auVar9._4_4_ & uVar11) * fVar5;
    uVar8 = -(uint)(fVar7 <= fVar6);
    fVar6 = logf((float)(~uVar8 & (uint)fVar7 | (uint)fVar6 & uVar8));
    tcu::TextureCubeView::sample
              ((TextureCubeView *)&stack0xffffffffffffffc0,local_48,packetTexcoords->m_data[0],
               packetTexcoords->m_data[1],packetTexcoords->m_data[2],fVar6 * 1.442695 + lodBias);
    output->m_data[0] = (float)local_40;
    output->m_data[1] = (float)uStack_3c;
    *(ConstPixelBufferAccess **)(output->m_data + 2) = pCStack_38;
    uVar3 = uVar3 + 1;
    output = output + 1;
    packetTexcoords = packetTexcoords + 1;
  } while (uVar3 != 4);
  return;
}

Assistant:

void TextureCube::sample4 (tcu::Vec4 output[4], const tcu::Vec3 packetTexcoords[4], float lodBias) const
{
	const float cubeSide = (float)m_view.getSize();

	// Each tex coord might be in a different face.

	for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
	{
		const tcu::CubeFace face		= tcu::selectCubeFace(packetTexcoords[fragNdx]);
		const tcu::Vec2		coords[4]	=
		{
			tcu::projectToFace(face, packetTexcoords[0]),
			tcu::projectToFace(face, packetTexcoords[1]),
			tcu::projectToFace(face, packetTexcoords[2]),
			tcu::projectToFace(face, packetTexcoords[3]),
		};

		const tcu::Vec2 dFdx0 = coords[1] - coords[0];
		const tcu::Vec2 dFdx1 = coords[3] - coords[2];
		const tcu::Vec2 dFdy0 = coords[2] - coords[0];
		const tcu::Vec2 dFdy1 = coords[3] - coords[1];

		const tcu::Vec2& dFdx = (fragNdx & 2) ? dFdx1 : dFdx0;
		const tcu::Vec2& dFdy = (fragNdx & 1) ? dFdy1 : dFdy0;

		const float mu = de::max(de::abs(dFdx.x()), de::abs(dFdy.x()));
		const float mv = de::max(de::abs(dFdx.y()), de::abs(dFdy.y()));
		const float p = de::max(mu * cubeSide, mv * cubeSide);

		const float	lod = deFloatLog2(p) + lodBias;

		output[fragNdx] = sample(packetTexcoords[fragNdx].x(), packetTexcoords[fragNdx].y(), packetTexcoords[fragNdx].z(), lod);
	}
}